

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitterstate.cpp
# Opt level: O3

void __thiscall YAML::EmitterState::EndedGroup(EmitterState *this,value type)

{
  pointer puVar1;
  size_t sVar2;
  unique_ptr<YAML::EmitterState::Group,_std::default_delete<YAML::EmitterState::Group>_> *__p;
  Group *pGVar3;
  Group *local_48 [2];
  undefined1 local_38 [16];
  Group *local_28;
  
  if ((this->m_groups).
      super__Vector_base<std::unique_ptr<YAML::EmitterState::Group,_std::default_delete<YAML::EmitterState::Group>_>,_std::allocator<std::unique_ptr<YAML::EmitterState::Group,_std::default_delete<YAML::EmitterState::Group>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->m_groups).
      super__Vector_base<std::unique_ptr<YAML::EmitterState::Group,_std::default_delete<YAML::EmitterState::Group>_>,_std::allocator<std::unique_ptr<YAML::EmitterState::Group,_std::default_delete<YAML::EmitterState::Group>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_48[0] = (Group *)local_38;
    if (type == Seq) {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_48,"unexpected end sequence token","");
      this->m_isGood = false;
      std::__cxx11::string::_M_assign((string *)&this->m_lastError);
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_48,"unexpected end map token","");
      this->m_isGood = false;
      std::__cxx11::string::_M_assign((string *)&this->m_lastError);
    }
    pGVar3 = local_48[0];
    if (local_48[0] == (Group *)local_38) {
      return;
    }
  }
  else {
    if (this->m_hasTag == true) {
      local_48[0] = (Group *)local_38;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"invalid tag","");
      this->m_isGood = false;
      std::__cxx11::string::_M_assign((string *)&this->m_lastError);
      if (local_48[0] != (Group *)local_38) {
        operator_delete(local_48[0]);
      }
    }
    if (this->m_hasAnchor == true) {
      local_48[0] = (Group *)local_38;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"invalid anchor","");
      this->m_isGood = false;
      std::__cxx11::string::_M_assign((string *)&this->m_lastError);
      if (local_48[0] != (Group *)local_38) {
        operator_delete(local_48[0]);
      }
    }
    puVar1 = (this->m_groups).
             super__Vector_base<std::unique_ptr<YAML::EmitterState::Group,_std::default_delete<YAML::EmitterState::Group>_>,_std::allocator<std::unique_ptr<YAML::EmitterState::Group,_std::default_delete<YAML::EmitterState::Group>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pGVar3 = puVar1[-1]._M_t.
             super___uniq_ptr_impl<YAML::EmitterState::Group,_std::default_delete<YAML::EmitterState::Group>_>
             ._M_t.
             super__Tuple_impl<0UL,_YAML::EmitterState::Group_*,_std::default_delete<YAML::EmitterState::Group>_>
             .super__Head_base<0UL,_YAML::EmitterState::Group_*,_false>._M_head_impl;
    puVar1[-1]._M_t.
    super___uniq_ptr_impl<YAML::EmitterState::Group,_std::default_delete<YAML::EmitterState::Group>_>
    ._M_t.
    super__Tuple_impl<0UL,_YAML::EmitterState::Group_*,_std::default_delete<YAML::EmitterState::Group>_>
    .super__Head_base<0UL,_YAML::EmitterState::Group_*,_false>._M_head_impl = (Group *)0x0;
    __p = (this->m_groups).
          super__Vector_base<std::unique_ptr<YAML::EmitterState::Group,_std::default_delete<YAML::EmitterState::Group>_>,_std::allocator<std::unique_ptr<YAML::EmitterState::Group,_std::default_delete<YAML::EmitterState::Group>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish + -1;
    (this->m_groups).
    super__Vector_base<std::unique_ptr<YAML::EmitterState::Group,_std::default_delete<YAML::EmitterState::Group>_>,_std::allocator<std::unique_ptr<YAML::EmitterState::Group,_std::default_delete<YAML::EmitterState::Group>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = __p;
    local_28 = pGVar3;
    __gnu_cxx::
    new_allocator<std::unique_ptr<YAML::EmitterState::Group,std::default_delete<YAML::EmitterState::Group>>>
    ::
    destroy<std::unique_ptr<YAML::EmitterState::Group,std::default_delete<YAML::EmitterState::Group>>>
              ((new_allocator<std::unique_ptr<YAML::EmitterState::Group,std::default_delete<YAML::EmitterState::Group>>>
                *)&this->m_groups,__p);
    if (pGVar3->type == type) {
      SettingChanges::clear(&pGVar3->modifiedSettings);
      std::
      vector<std::unique_ptr<YAML::SettingChangeBase,_std::default_delete<YAML::SettingChangeBase>_>,_std::allocator<std::unique_ptr<YAML::SettingChangeBase,_std::default_delete<YAML::SettingChangeBase>_>_>_>
      ::~vector(&(pGVar3->modifiedSettings).m_settingChanges);
      operator_delete(pGVar3);
      puVar1 = (this->m_groups).
               super__Vector_base<std::unique_ptr<YAML::EmitterState::Group,_std::default_delete<YAML::EmitterState::Group>_>,_std::allocator<std::unique_ptr<YAML::EmitterState::Group,_std::default_delete<YAML::EmitterState::Group>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if ((this->m_groups).
          super__Vector_base<std::unique_ptr<YAML::EmitterState::Group,_std::default_delete<YAML::EmitterState::Group>_>,_std::allocator<std::unique_ptr<YAML::EmitterState::Group,_std::default_delete<YAML::EmitterState::Group>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start == puVar1) {
        sVar2 = 0;
      }
      else {
        sVar2 = (puVar1[-1]._M_t.
                 super___uniq_ptr_impl<YAML::EmitterState::Group,_std::default_delete<YAML::EmitterState::Group>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_YAML::EmitterState::Group_*,_std::default_delete<YAML::EmitterState::Group>_>
                 .super__Head_base<0UL,_YAML::EmitterState::Group_*,_false>._M_head_impl)->indent;
      }
      this->m_curIndent = this->m_curIndent - sVar2;
      SettingChanges::restore(&this->m_globalModifiedSettings);
      SettingChanges::clear(&this->m_modifiedSettings);
      this->m_hasAnchor = false;
      this->m_hasTag = false;
      this->m_hasNonContent = false;
      return;
    }
    local_48[0] = (Group *)local_38;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"unmatched group tag","");
    this->m_isGood = false;
    std::__cxx11::string::_M_assign((string *)&this->m_lastError);
    if (local_48[0] != (Group *)local_38) {
      operator_delete(local_48[0]);
    }
    SettingChanges::clear(&pGVar3->modifiedSettings);
    std::
    vector<std::unique_ptr<YAML::SettingChangeBase,_std::default_delete<YAML::SettingChangeBase>_>,_std::allocator<std::unique_ptr<YAML::SettingChangeBase,_std::default_delete<YAML::SettingChangeBase>_>_>_>
    ::~vector(&(pGVar3->modifiedSettings).m_settingChanges);
  }
  operator_delete(pGVar3);
  return;
}

Assistant:

void EmitterState::EndedGroup(GroupType::value type) {
  if (m_groups.empty()) {
    if (type == GroupType::Seq) {
      return SetError(ErrorMsg::UNEXPECTED_END_SEQ);
    }
    return SetError(ErrorMsg::UNEXPECTED_END_MAP);
  }

  if (m_hasTag) {
    SetError(ErrorMsg::INVALID_TAG);
  }
  if (m_hasAnchor) {
    SetError(ErrorMsg::INVALID_ANCHOR);
  }

  // get rid of the current group
  {
    std::unique_ptr<Group> pFinishedGroup = std::move(m_groups.back());
    m_groups.pop_back();
    if (pFinishedGroup->type != type) {
      return SetError(ErrorMsg::UNMATCHED_GROUP_TAG);
    }
  }

  // reset old settings
  std::size_t lastIndent = (m_groups.empty() ? 0 : m_groups.back()->indent);
  assert(m_curIndent >= lastIndent);
  m_curIndent -= lastIndent;

  // some global settings that we changed may have been overridden
  // by a local setting we just popped, so we need to restore them
  m_globalModifiedSettings.restore();

  ClearModifiedSettings();
  m_hasAnchor = false;
  m_hasTag = false;
  m_hasNonContent = false;
}